

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O3

int pcap_setnonblock_fd(pcap_t *p,int nonblock,char *errbuf)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *__format;
  
  uVar1 = fcntl(p->fd,3,0);
  if (uVar1 == 0xffffffff) {
    __format = "F_GETFL: %s";
  }
  else {
    iVar2 = fcntl(p->fd,4,(ulong)((uint)(nonblock != 0) << 0xb | uVar1 & 0xfffff7ff));
    if (iVar2 != -1) {
      return 0;
    }
    __format = "F_SETFL: %s";
  }
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  snprintf(errbuf,0x100,__format,pcVar4);
  return -1;
}

Assistant:

int
pcap_setnonblock_fd(pcap_t *p, int nonblock, char *errbuf)
{
	int fdflags;

	fdflags = fcntl(p->fd, F_GETFL, 0);
	if (fdflags == -1) {
		pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE, "F_GETFL: %s",
		    pcap_strerror(errno));
		return (-1);
	}
	if (nonblock)
		fdflags |= O_NONBLOCK;
	else
		fdflags &= ~O_NONBLOCK;
	if (fcntl(p->fd, F_SETFL, fdflags) == -1) {
		pcap_snprintf(errbuf, PCAP_ERRBUF_SIZE, "F_SETFL: %s",
		    pcap_strerror(errno));
		return (-1);
	}
	return (0);
}